

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

void __thiscall ODDLParser::OpenDDLParser::~OpenDDLParser(OpenDDLParser *this)

{
  pointer ppDVar1;
  pointer pcVar2;
  
  clear(this);
  ppDVar1 = (this->m_stack).
            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1);
  }
  pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

OpenDDLParser::~OpenDDLParser() {
    clear();
}